

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::JunitReporter::writeGroup(JunitReporter *this,TestGroupNode *groupNode,double suiteTime)

{
  XmlWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pPVar2;
  int iVar3;
  pointer pPVar4;
  ScopedElement scoped;
  ScopedElement e;
  string local_a0;
  ScopedElement local_80;
  ScopedElement local_78;
  string local_70;
  string local_50;
  double local_30;
  
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  local_30 = suiteTime;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"testsuite","");
  this_00 = &this->xml;
  local_78.m_writer = this_00;
  XmlWriter::startElement(this_00,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"name","");
  XmlWriter::writeAttribute(this_00,&local_a0,&(groupNode->value).groupInfo.name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"errors","");
  XmlWriter::writeAttribute<unsigned_int>(this_00,&local_a0,&this->unexpectedExceptions);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"failures","");
  local_70._M_dataplus._M_p =
       (pointer)((groupNode->value).totals.assertions.failed - (ulong)this->unexpectedExceptions);
  XmlWriter::writeAttribute<unsigned_long>(this_00,&local_a0,(unsigned_long *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"tests","");
  local_70._M_dataplus._M_p =
       (pointer)((groupNode->value).totals.assertions.failed +
                 (groupNode->value).totals.assertions.passed +
                (groupNode->value).totals.assertions.failedButOk);
  XmlWriter::writeAttribute<unsigned_long>(this_00,&local_a0,(unsigned_long *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"hostname","");
  XmlWriter::writeAttribute<char[4]>(this_00,&local_a0,(char (*) [4])"tbd");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  iVar3 = (*(((this->super_CumulativeReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xc])();
  if (iVar3 == 2) {
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"time","");
    XmlWriter::writeAttribute<char[1]>(this_00,&local_a0,(char (*) [1])0x134de9);
  }
  else {
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"time","");
    XmlWriter::writeAttribute<double>(this_00,&local_a0,&local_30);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"timestamp","");
  XmlWriter::writeAttribute<char[4]>(this_00,&local_a0,(char (*) [4])"tbd");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  pPVar2 = (groupNode->children).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar4 = (groupNode->children).
                super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar4 != pPVar2; pPVar4 = pPVar4 + 1) {
    writeTestCase(this,pPVar4->m_p);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"system-out","");
  local_80.m_writer = this_00;
  XmlWriter::startElement(this_00,&local_a0);
  std::__cxx11::stringbuf::str();
  trim(&local_70,&local_50);
  XmlWriter::writeText(local_80.m_writer,&local_70,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  XmlWriter::ScopedElement::~ScopedElement(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"system-err","");
  local_80.m_writer = this_00;
  XmlWriter::startElement(this_00,&local_a0);
  std::__cxx11::stringbuf::str();
  trim(&local_70,&local_50);
  XmlWriter::writeText(local_80.m_writer,&local_70,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  XmlWriter::ScopedElement::~ScopedElement(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  XmlWriter::ScopedElement::~ScopedElement(&local_78);
  return;
}

Assistant:

void writeGroup( TestGroupNode const& groupNode, double suiteTime ) {
            XmlWriter::ScopedElement e = xml.scopedElement( "testsuite" );
            TestGroupStats const& stats = groupNode.value;
            xml.writeAttribute( "name", stats.groupInfo.name );
            xml.writeAttribute( "errors", unexpectedExceptions );
            xml.writeAttribute( "failures", stats.totals.assertions.failed-unexpectedExceptions );
            xml.writeAttribute( "tests", stats.totals.assertions.total() );
            xml.writeAttribute( "hostname", "tbd" ); // !TBD
            if( m_config->showDurations() == ShowDurations::Never )
                xml.writeAttribute( "time", "" );
            else
                xml.writeAttribute( "time", suiteTime );
            xml.writeAttribute( "timestamp", "tbd" ); // !TBD

            // Write test cases
            for( TestGroupNode::ChildNodes::const_iterator
                    it = groupNode.children.begin(), itEnd = groupNode.children.end();
                    it != itEnd;
                    ++it )
                writeTestCase( **it );

            xml.scopedElement( "system-out" ).writeText( trim( stdOutForSuite.str() ), false );
            xml.scopedElement( "system-err" ).writeText( trim( stdErrForSuite.str() ), false );
        }